

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ARGBSobelToPlane(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_y,int dst_stride_y,int width
                    ,int height)

{
  int iVar1;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *SobelToPlaneRow;
  uint8_t *in_stack_00000038;
  int in_stack_00000044;
  uint8_t *in_stack_00000048;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *in_stack_00000060;
  
  libyuv::TestCpuFlag(0);
  iVar1 = libyuv::ARGBSobelize
                    (in_stack_00000048,in_stack_00000044,in_stack_00000038,src_argb._4_4_,
                     (int)src_argb,src_stride_argb,in_stack_00000060);
  return iVar1;
}

Assistant:

LIBYUV_API
int ARGBSobelToPlane(const uint8_t* src_argb,
                     int src_stride_argb,
                     uint8_t* dst_y,
                     int dst_stride_y,
                     int width,
                     int height) {
  void (*SobelToPlaneRow)(const uint8_t* src_sobelx, const uint8_t* src_sobely,
                          uint8_t* dst_, int width) = SobelToPlaneRow_C;
#if defined(HAS_SOBELTOPLANEROW_SSE2)
  if (TestCpuFlag(kCpuHasSSE2)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_SSE2;
    if (IS_ALIGNED(width, 16)) {
      SobelToPlaneRow = SobelToPlaneRow_SSE2;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      SobelToPlaneRow = SobelToPlaneRow_NEON;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      SobelToPlaneRow = SobelToPlaneRow_MMI;
    }
  }
#endif
#if defined(HAS_SOBELTOPLANEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    SobelToPlaneRow = SobelToPlaneRow_Any_MSA;
    if (IS_ALIGNED(width, 32)) {
      SobelToPlaneRow = SobelToPlaneRow_MSA;
    }
  }
#endif
  return ARGBSobelize(src_argb, src_stride_argb, dst_y, dst_stride_y, width,
                      height, SobelToPlaneRow);
}